

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

unsigned_long
libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL *channel,unsigned_long adj,uchar force)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  ulong in_RAX;
  time_t start_time;
  ulong uStack_38;
  uint window;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return 0xffffffffffffffd9;
  }
  uStack_38 = in_RAX;
  start_time = time((time_t *)0x0);
  do {
    iVar1 = _libssh2_channel_receive_window_adjust(channel,(uint32_t)adj,force,&window);
    if (iVar1 != -0x25) {
      if (iVar1 == 0) {
        return uStack_38 >> 0x20;
      }
      return (long)iVar1;
    }
    session = channel->session;
    iVar1 = -0x25;
  } while (((session != (LIBSSH2_SESSION *)0x0) && (session->api_block_mode != 0)) &&
          (iVar1 = _libssh2_wait_socket(session,start_time), iVar1 == 0));
  return (long)iVar1;
}

Assistant:

LIBSSH2_API unsigned long
libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL *channel,
                                      unsigned long adj,
                                      unsigned char force)
{
    unsigned int window;
    int rc;

    if(!channel)
        return (unsigned long)LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, channel->session,
                 _libssh2_channel_receive_window_adjust(channel,
                                                        (uint32_t)adj,
                                                        force, &window));

    /* stupid - but this is how it was made to work before and this is just
       kept for backwards compatibility */
    return rc ? (unsigned long)rc : window;
}